

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O3

PSymbol * __thiscall
PSymbolTable::FindSymbolInTable(PSymbolTable *this,FName *symname,PSymbolTable **symtable)

{
  Node *pNVar1;
  PSymbol *pPVar2;
  Node *pNVar3;
  FName local_4;
  
  pNVar1 = (this->Symbols).Nodes + ((this->Symbols).Size - 1 & symname->Index);
  while ((pNVar3 = pNVar1, pNVar3 != (Node *)0x0 && (pNVar3->Next != (Node *)0x1))) {
    pNVar1 = pNVar3->Next;
    if ((pNVar3->Pair).Key.Index == symname->Index) {
      *symtable = this;
      return (pNVar3->Pair).Value;
    }
  }
  if (this->ParentSymbolTable != (PSymbolTable *)0x0) {
    pPVar2 = FindSymbolInTable(this->ParentSymbolTable,&local_4,symtable);
    return pPVar2;
  }
  *symtable = (PSymbolTable *)0x0;
  return (PSymbol *)0x0;
}

Assistant:

PSymbol *PSymbolTable::FindSymbolInTable(FName symname, PSymbolTable *&symtable)
{
	PSymbol * const *value = Symbols.CheckKey(symname);
	if (value == NULL)
	{
		if (ParentSymbolTable != NULL)
		{
			return ParentSymbolTable->FindSymbolInTable(symname, symtable);
		}
		symtable = NULL;
		return NULL;
	}
	symtable = this;
	return *value;
}